

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall t_lua_generator::init_generator(t_lua_generator *this)

{
  char *pcVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ostream *poVar3;
  int __oflag;
  int __oflag_00;
  t_program *extraout_RDX;
  t_program *extraout_RDX_00;
  t_program *program;
  string local_200;
  string local_1e0 [32];
  string local_1c0;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string f_types_name;
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string f_consts_name;
  string cur_namespace;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  undefined1 local_30 [4];
  int r;
  string outdir;
  t_lua_generator *this_local;
  
  outdir.field_2._8_8_ = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_34 = mkdir(pcVar1,0x1ff);
  program = extraout_RDX;
  if (local_34 == -1) {
    piVar2 = __errno_location();
    program = extraout_RDX_00;
    if (*piVar2 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      pcVar1 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
      std::operator+(&local_58,&local_78,": ");
      piVar2 = __errno_location();
      pcVar1 = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&local_58,pcVar1);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  get_namespace_abi_cxx11_
            ((string *)((long)&f_consts_name.field_2 + 8),
             (t_lua_generator *)(this->super_t_oop_generator).super_t_generator.program_,program);
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_consts_name.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 &local_f0,"constants.lua");
  std::__cxx11::string::~string((string *)&local_f0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,pcVar1,(allocator *)(f_types_name.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_consts_,(char *)local_110,__oflag);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)(f_types_name.field_2._M_local_buf + 0xf));
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_consts_name.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 &local_158,"ttypes.lua");
  std::__cxx11::string::~string((string *)&local_158);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,pcVar1,&local_179);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_,(char *)local_178,__oflag_00);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_1a0);
  poVar3 = std::operator<<((ostream *)&this->f_consts_,local_1a0);
  lua_includes_abi_cxx11_(&local_1c0,this);
  std::operator<<(poVar3,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string(local_1a0);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_1e0);
  poVar3 = std::operator<<((ostream *)&this->f_types_,local_1e0);
  lua_includes_abi_cxx11_(&local_200,this);
  std::operator<<(poVar3,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string(local_1e0);
  if ((this->gen_requires_ & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"require \'");
    poVar3 = std::operator<<(poVar3,(string *)(f_consts_name.field_2._M_local_buf + 8));
    std::operator<<(poVar3,"constants\'");
  }
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(f_consts_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void t_lua_generator::init_generator() {
  // Make output directory
  string outdir = get_out_dir();
  MKDIR(outdir.c_str());

  // Make output files
  string cur_namespace = get_namespace(program_);
  string f_consts_name = outdir + cur_namespace + "constants.lua";
  f_consts_.open(f_consts_name.c_str());
  string f_types_name = outdir + cur_namespace + "ttypes.lua";
  f_types_.open(f_types_name.c_str());

  // Add headers
  f_consts_ << autogen_comment() << lua_includes();
  f_types_ << autogen_comment() << lua_includes();
  if (gen_requires_) {
    f_types_ << endl << "require '" << cur_namespace << "constants'";
  }
}